

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SDL_gpu_matrix.c
# Opt level: O2

void GPU_MatrixMultiply(float *result,float *A,float *B)

{
  *result = B[3] * A[0xc] + B[2] * A[8] + *B * *A + B[1] * A[4];
  result[1] = B[3] * A[0xd] + B[2] * A[9] + *B * A[1] + B[1] * A[5];
  result[2] = B[3] * A[0xe] + B[2] * A[10] + *B * A[2] + B[1] * A[6];
  result[3] = B[3] * A[0xf] + B[2] * A[0xb] + *B * A[3] + B[1] * A[7];
  result[4] = B[7] * A[0xc] + B[6] * A[8] + B[4] * *A + B[5] * A[4];
  result[5] = B[7] * A[0xd] + B[6] * A[9] + B[4] * A[1] + B[5] * A[5];
  result[6] = B[7] * A[0xe] + B[6] * A[10] + B[4] * A[2] + B[5] * A[6];
  result[7] = B[7] * A[0xf] + B[6] * A[0xb] + B[4] * A[3] + B[5] * A[7];
  result[8] = B[0xb] * A[0xc] + B[10] * A[8] + B[8] * *A + B[9] * A[4];
  result[9] = B[0xb] * A[0xd] + B[10] * A[9] + B[8] * A[1] + B[9] * A[5];
  result[10] = B[0xb] * A[0xe] + B[10] * A[10] + B[8] * A[2] + B[9] * A[6];
  result[0xb] = B[0xb] * A[0xf] + B[10] * A[0xb] + B[8] * A[3] + B[9] * A[7];
  result[0xc] = B[0xf] * A[0xc] + B[0xe] * A[8] + B[0xc] * *A + B[0xd] * A[4];
  result[0xd] = B[0xf] * A[0xd] + B[0xe] * A[9] + B[0xc] * A[1] + B[0xd] * A[5];
  result[0xe] = B[0xf] * A[0xe] + B[0xe] * A[10] + B[0xc] * A[2] + B[0xd] * A[6];
  result[0xf] = B[0xf] * A[0xf] + B[0xe] * A[0xb] + B[0xc] * A[3] + B[0xd] * A[7];
  return;
}

Assistant:

void GPU_MatrixMultiply(float* result, const float* A, const float* B)
{
    float (*matR)[4] = (float(*)[4])result;
    float (*matA)[4] = (float(*)[4])A;
    float (*matB)[4] = (float(*)[4])B;
    matR[0][0] = matB[0][0] * matA[0][0] + matB[0][1] * matA[1][0] + matB[0][2] * matA[2][0] + matB[0][3] * matA[3][0]; 
    matR[0][1] = matB[0][0] * matA[0][1] + matB[0][1] * matA[1][1] + matB[0][2] * matA[2][1] + matB[0][3] * matA[3][1]; 
    matR[0][2] = matB[0][0] * matA[0][2] + matB[0][1] * matA[1][2] + matB[0][2] * matA[2][2] + matB[0][3] * matA[3][2]; 
    matR[0][3] = matB[0][0] * matA[0][3] + matB[0][1] * matA[1][3] + matB[0][2] * matA[2][3] + matB[0][3] * matA[3][3]; 
    matR[1][0] = matB[1][0] * matA[0][0] + matB[1][1] * matA[1][0] + matB[1][2] * matA[2][0] + matB[1][3] * matA[3][0]; 
    matR[1][1] = matB[1][0] * matA[0][1] + matB[1][1] * matA[1][1] + matB[1][2] * matA[2][1] + matB[1][3] * matA[3][1]; 
    matR[1][2] = matB[1][0] * matA[0][2] + matB[1][1] * matA[1][2] + matB[1][2] * matA[2][2] + matB[1][3] * matA[3][2]; 
    matR[1][3] = matB[1][0] * matA[0][3] + matB[1][1] * matA[1][3] + matB[1][2] * matA[2][3] + matB[1][3] * matA[3][3]; 
    matR[2][0] = matB[2][0] * matA[0][0] + matB[2][1] * matA[1][0] + matB[2][2] * matA[2][0] + matB[2][3] * matA[3][0]; 
    matR[2][1] = matB[2][0] * matA[0][1] + matB[2][1] * matA[1][1] + matB[2][2] * matA[2][1] + matB[2][3] * matA[3][1]; 
    matR[2][2] = matB[2][0] * matA[0][2] + matB[2][1] * matA[1][2] + matB[2][2] * matA[2][2] + matB[2][3] * matA[3][2]; 
    matR[2][3] = matB[2][0] * matA[0][3] + matB[2][1] * matA[1][3] + matB[2][2] * matA[2][3] + matB[2][3] * matA[3][3]; 
    matR[3][0] = matB[3][0] * matA[0][0] + matB[3][1] * matA[1][0] + matB[3][2] * matA[2][0] + matB[3][3] * matA[3][0]; 
    matR[3][1] = matB[3][0] * matA[0][1] + matB[3][1] * matA[1][1] + matB[3][2] * matA[2][1] + matB[3][3] * matA[3][1]; 
    matR[3][2] = matB[3][0] * matA[0][2] + matB[3][1] * matA[1][2] + matB[3][2] * matA[2][2] + matB[3][3] * matA[3][2]; 
    matR[3][3] = matB[3][0] * matA[0][3] + matB[3][1] * matA[1][3] + matB[3][2] * matA[2][3] + matB[3][3] * matA[3][3];
}